

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryCopy(Replacer *this,MemoryCopy *curr)

{
  char *pcVar1;
  string_view memory;
  Index index;
  Index sizeIdx;
  LocalSet *localSet;
  Expression *pEVar2;
  LocalGet *pLVar3;
  long lStackY_50;
  
  if (this->parent->checkBounds == true) {
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .currFunction,(Type)(this->parent->pointerType).id);
    sizeIdx = Builder::addVar((this->
                              super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                              ).
                              super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                              .
                              super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                              .currFunction,(Type)(this->parent->pointerType).id);
    memory = (curr->destMemory).super_IString.str;
    localSet = Builder::makeLocalSet(&this->builder,index,curr->source);
    pEVar2 = getDest<wasm::MemoryCopy>
                       (this,curr,(Name)memory,sizeIdx,(Expression *)localSet,(Expression *)0x0);
    curr->dest = pEVar2;
    pEVar2 = getSource(this,curr,sizeIdx,index);
    curr->source = pEVar2;
    pLVar3 = Builder::makeLocalGet(&this->builder,sizeIdx,(Type)(this->parent->pointerType).id);
    lStackY_50 = 0x20;
  }
  else {
    pEVar2 = getDest<wasm::MemoryCopy>
                       (this,curr,(Name)(curr->destMemory).super_IString.str,0xffffffff,
                        (Expression *)0x0,(Expression *)0x0);
    curr->dest = pEVar2;
    pLVar3 = (LocalGet *)getSource(this,curr,0xffffffff,0xffffffff);
    lStackY_50 = 0x18;
  }
  *(LocalGet **)
   (&(curr->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression._id + lStackY_50) =
       pLVar3;
  pcVar1 = (this->parent->combinedMemory).super_IString.str._M_str;
  (curr->destMemory).super_IString.str._M_len =
       (this->parent->combinedMemory).super_IString.str._M_len;
  (curr->destMemory).super_IString.str._M_str = pcVar1;
  pcVar1 = (this->parent->combinedMemory).super_IString.str._M_str;
  (curr->sourceMemory).super_IString.str._M_len =
       (this->parent->combinedMemory).super_IString.str._M_len;
  (curr->sourceMemory).super_IString.str._M_str = pcVar1;
  return;
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
      if (parent.checkBounds) {
        Index sourceIdx = Builder::addVar(getFunction(), parent.pointerType);
        Index sizeIdx = Builder::addVar(getFunction(), parent.pointerType);
        curr->dest = getDest(curr,
                             curr->destMemory,
                             sizeIdx,
                             builder.makeLocalSet(sourceIdx, curr->source));
        curr->source = getSource(curr, sizeIdx, sourceIdx);
        curr->size = builder.makeLocalGet(sizeIdx, parent.pointerType);
      } else {
        curr->dest = getDest(curr, curr->destMemory);
        curr->source = getSource(curr);
      }
      curr->destMemory = parent.combinedMemory;
      curr->sourceMemory = parent.combinedMemory;
    }